

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_replaceRangeCString_success_smallerReplaceLength_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x1375f7;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"012xxx45",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x137647;
  bVar1 = AString_replaceRangeCString(&string,3,3,"3",1);
  if (bVar1 == false) {
    uStack_50 = 0x137740;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5f3,
                      "Assertion \'AString_replaceRangeCString(&string, 3, 3, \"3\", 1)\' failed",0,
                      0);
  }
  uStack_50 = 0x137660;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5f3);
  if (string.capacity == 8) {
    uStack_50 = 0x137680;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5f4);
    if (string.buffer == (char *)0x0) {
      ppcVar7 = &local_58;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (string).buffer != NULL";
      pcVar9 = "(void*) (string).buffer";
      iVar2 = 0x5f4;
LAB_00137899:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) =
           test_AString_replaceRangeCString_success_biggerReplaceLength_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_50 = 0x13769d;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5f4);
    pcVar9 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar4 = "";
      pcVar9 = "(null)";
    }
    else {
      uStack_50 = 0x1376ba;
      iVar2 = strcmp("012345",string.buffer);
      if (iVar2 == 0) {
        uStack_50 = 0x1376d3;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x5f4);
        if (string.size == 6) {
          uStack_50 = 0x1376f3;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5f4);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_50 = 0x137714;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x5f5);
            uStack_50 = 0x13771d;
            (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
            return;
          }
          ppcVar7 = &local_68;
          local_60 = "(0)";
          local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x5f5;
          goto LAB_00137899;
        }
        local_60 = "strlen(\"012345\")";
        pcVar5 = "(string).size == strlen(\"012345\")";
        pcVar8 = "(string).size";
        local_58 = (char *)0x6;
        pcVar4 = (char *)string.size;
        goto LAB_0013784c;
      }
      pcVar4 = "\"";
    }
    expr = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar5 = "(string).buffer == (\"012345\")";
    pcVar8 = "(string).buffer";
    local_58 = "\"";
    local_60 = "012345";
    local_68 = "\"";
    pcStack_70 = "(\"012345\")";
    ppcVar6 = &pcStack_80;
    pcStack_80 = pcVar9;
    pcStack_78 = pcVar4;
  }
  else {
    local_60 = "(8)";
    pcVar5 = "(string).capacity == (8)";
    pcVar8 = "(string).capacity";
    local_58 = (char *)0x8;
    pcVar4 = (char *)string.capacity;
LAB_0013784c:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_60;
  }
  uStack_50 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x137855;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x5f4,expr,pcVar3,pcVar5,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRangeCString_success_smallerReplaceLength)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012xxx45", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 3, 3, "3", 1));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012345", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}